

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicMax::Check(BasicMax *this,GLenum e,GLint64 value,bool max_value)

{
  ShaderStorageBufferObjectBase *this_00;
  char *pcVar1;
  undefined7 in_register_00000009;
  char *format;
  CallLogWrapper *this_01;
  GLint i;
  GLboolean b;
  GLfloat f;
  GLint64 i64;
  uint local_44;
  GLboolean local_3d;
  float local_3c;
  long local_38;
  
  this_00 = (ShaderStorageBufferObjectBase *)(ulong)e;
  this_01 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_01,e,(GLint *)&local_44);
  glu::CallLogWrapper::glGetInteger64v(this_01,e,&local_38);
  glu::CallLogWrapper::glGetFloatv(this_01,e,&local_3c);
  glu::CallLogWrapper::glGetBooleanv(this_01,e,&local_3d);
  if ((int)CONCAT71(in_register_00000009,max_value) == 0) {
    if (((long)local_3c <= value && local_38 <= value) && (int)local_44 <= value) {
      return true;
    }
    pcVar1 = ShaderStorageBufferObjectBase::GLenumToString(this_00,e);
    format = "%s is %d should be at most %d.\n";
  }
  else {
    if ((value <= (long)local_3c && value <= local_38) && value <= (int)local_44) {
      return true;
    }
    pcVar1 = ShaderStorageBufferObjectBase::GLenumToString(this_00,e);
    format = "%s is %d should be at least %d.\n";
  }
  anon_unknown_0::Output(format,pcVar1,(ulong)local_44,value & 0xffffffff);
  return false;
}

Assistant:

bool Check(GLenum e, GLint64 value, bool max_value)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLboolean b;

		glGetIntegerv(e, &i);
		glGetInteger64v(e, &i64);
		glGetFloatv(e, &f);
		glGetBooleanv(e, &b);

		bool status = true;
		if (max_value)
		{
			if (static_cast<GLint64>(i) < value)
				status = false;
			if (i64 < value)
				status = false;
			if (static_cast<GLint64>(f) < value)
				status = false;

			if (!status)
			{
				Output("%s is %d should be at least %d.\n", GLenumToString(e), i, static_cast<GLint>(value));
			}
		}
		else
		{
			if (static_cast<GLint64>(i) > value)
				status = false;
			if (i64 > value)
				status = false;
			if (static_cast<GLint64>(f) > value)
				status = false;

			if (!status)
			{
				Output("%s is %d should be at most %d.\n", GLenumToString(e), i, static_cast<GLint>(value));
			}
		}
		return status;
	}